

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbrp_init_target(stbrp_context *con,int pw,int ph,stbrp_node *nodes,int num_nodes)

{
  int num_nodes_local;
  stbrp_node *nodes_local;
  int ph_local;
  int pw_local;
  stbrp_context *con_local;
  
  con->width = pw;
  con->height = ph;
  con->x = 0;
  con->y = 0;
  con->bottom_y = 0;
  return;
}

Assistant:

static void stbrp_init_target(stbrp_context *con, int pw, int ph, stbrp_node *nodes, int num_nodes)
{
   con->width  = pw;
   con->height = ph;
   con->x = 0;
   con->y = 0;
   con->bottom_y = 0;
   STBTT__NOTUSED(nodes);
   STBTT__NOTUSED(num_nodes);   
}